

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void Lodtalk_restart(FILE *input_file,yyscan_t yyscanner)

{
  YY_BUFFER_STATE pyVar1;
  undefined8 local_30;
  undefined8 local_28;
  yyguts_t *yyg;
  yyscan_t yyscanner_local;
  FILE *input_file_local;
  
  if (*(long *)((long)yyscanner + 0x28) == 0) {
    local_28 = 0;
  }
  else {
    local_28 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  }
  if (local_28 == 0) {
    Lodtalk_ensure_buffer_stack(yyscanner);
    pyVar1 = Lodtalk__create_buffer(*(FILE **)((long)yyscanner + 8),0x4000,yyscanner);
    *(YY_BUFFER_STATE *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
         = pyVar1;
  }
  if (*(long *)((long)yyscanner + 0x28) == 0) {
    local_30 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_30 = *(YY_BUFFER_STATE *)
                (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  }
  Lodtalk__init_buffer(local_30,input_file,yyscanner);
  Lodtalk__load_buffer_state(yyscanner);
  return;
}

Assistant:

void yyrestart  (FILE * input_file , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack (yyscanner);
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE , yyscanner);
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file , yyscanner);
	yy_load_buffer_state( yyscanner );
}